

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

int32 mmi_accum_gauden(float32 ***denacc,uint32 *lcl2gbl,uint32 n_lcl2gbl,vector_t *frame,
                      uint32 ***den_idx,gauden_t *g,int32 mean_reest,int32 var_reest,
                      float64 arc_gamma,feat_t *fcb)

{
  uint uVar1;
  vector_t ***ppppfVar2;
  vector_t ***ppppfVar3;
  float32 ***pppfVar4;
  vector_t pfVar5;
  vector_t pfVar6;
  float fVar7;
  double dVar8;
  vector_t feat;
  float32 obs_cnt;
  float32 ***dnom;
  vector_t v;
  vector_t ***vacc;
  vector_t m;
  vector_t ***macc;
  uint32 l;
  uint32 kk;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 g_i;
  float64 arc_gamma_local;
  gauden_t *g_local;
  uint32 ***den_idx_local;
  vector_t *frame_local;
  uint32 n_lcl2gbl_local;
  uint32 *lcl2gbl_local;
  float32 ***denacc_local;
  
  ppppfVar2 = g->l_macc;
  ppppfVar3 = g->l_vacc;
  dnom = (float32 ***)0x0;
  pppfVar4 = g->l_dnom;
  for (k = 0; k < n_lcl2gbl; k = k + 1) {
    for (kk = 0; kk < g->n_feat; kk = kk + 1) {
      pfVar5 = frame[kk];
      for (macc._4_4_ = 0; macc._4_4_ < g->n_top; macc._4_4_ = macc._4_4_ + 1) {
        uVar1 = den_idx[k][kk][macc._4_4_];
        fVar7 = (float)denacc[k][kk][uVar1];
        dVar8 = exp((double)arc_gamma);
        fVar7 = (float)((double)fVar7 * dVar8);
        if (1.2e-38 < fVar7) {
          pfVar6 = ppppfVar2[k][kk][uVar1];
          if (var_reest != 0) {
            dnom = (float32 ***)ppppfVar3[k][kk][uVar1];
          }
          for (macc._0_4_ = 0; (uint)macc < g->veclen[kk]; macc._0_4_ = (uint)macc + 1) {
            if (mean_reest != 0) {
              pfVar6[(uint)macc] = fVar7 * pfVar5[(uint)macc] + pfVar6[(uint)macc];
            }
            if (var_reest != 0) {
              *(float *)((long)dnom + (ulong)(uint)macc * 4) =
                   fVar7 * pfVar5[(uint)macc] * pfVar5[(uint)macc] +
                   *(float *)((long)dnom + (ulong)(uint)macc * 4);
            }
          }
          pppfVar4[k][kk][uVar1] = (float32)(fVar7 + (float)pppfVar4[k][kk][uVar1]);
        }
      }
    }
  }
  return 0;
}

Assistant:

int
mmi_accum_gauden(float32 ***denacc,
		 uint32 *lcl2gbl,
		 uint32 n_lcl2gbl,
		 vector_t *frame,
		 uint32 ***den_idx,
		 gauden_t *g,
		 int32 mean_reest,
		 int32 var_reest,
		 float64 arc_gamma,
		 feat_t *fcb)
{
  uint32 g_i, i, j, k, kk, l;
  
  vector_t ***macc = g->l_macc;     /* local to utt */
  vector_t m;
  
  vector_t ***vacc = g->l_vacc;
  vector_t v = NULL;
  
  float32 ***dnom = g->l_dnom;
  
  float32 obs_cnt;

  /* for each density family found in the utterance */
  for (i = 0; i < n_lcl2gbl; i++) {

    g_i = lcl2gbl[i];
    
    /* for each feature */
    for (j = 0; j < gauden_n_feat(g); j++) {
      vector_t feat = frame[j];
      
      /* for each density in the mixture density */
      for (kk = 0; kk < gauden_n_top(g); kk++) {
	
	k = den_idx[i][j][kk];                       /* i.e. density k is one of the n_top densities */
	
	obs_cnt = denacc[i][j][k] * exp(arc_gamma);  /* observation count for density (k) at this time frame
							given the model */
	
	/* don't bother adding a bunch of essentially zero values */
	if (obs_cnt <= MIN_POS_FLOAT32)
	  continue;
	
	m = macc[i][j][k];                          /* the vector accumulator for mean (i,j,k) */
	
	if (var_reest) {
	  v = vacc[i][j][k];                        /* the vector accumulator for variance (i,j,k) */
	}
	
	for (l = 0; l < g->veclen[j]; l++) {
	  if (mean_reest) {
	    m[l] += obs_cnt * feat[l];
	  }
	    
	  if (var_reest) {
	    v[l] += obs_cnt * feat[l] * feat[l];
	  }
	}
	/* accumulate observation count for all densities */
	dnom[i][j][k] += obs_cnt;
      }
    }
  }
  
  return S3_SUCCESS;
}